

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

OpenCLKernel * __thiscall ocl::OpenCLEngine::findKernel(OpenCLEngine *this,int id)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  int id_local;
  OpenCLEngine *this_local;
  
  it._M_node._4_4_ = id;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
       ::find(&this->kernels_,(key_type *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
       ::end(&this->kernels_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_ocl::OpenCLKernel_*>_>::operator->
                       (&local_28);
    this_local = (OpenCLEngine *)ppVar2->second;
  }
  else {
    this_local = (OpenCLEngine *)0x0;
  }
  return (OpenCLKernel *)this_local;
}

Assistant:

OpenCLKernel *OpenCLEngine::findKernel(int id) const
{
	std::map<int, OpenCLKernel *>::const_iterator it = kernels_.find(id);
	if (it != kernels_.end())
		return it->second;
	return 0;
}